

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<std::pair<QListWidgetItem_*,_int>_>::data(QList<std::pair<QListWidgetItem_*,_int>_> *this)

{
  QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *this_00;
  pair<QListWidgetItem_*,_int> *ppVar1;
  QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *in_RDI;
  
  detach((QList<std::pair<QListWidgetItem_*,_int>_> *)0x8a68ec);
  this_00 = (QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *)
            QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_>::operator->(in_RDI);
  ppVar1 = QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_>::data(this_00);
  return ppVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }